

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

zt_ipv4_node * zt_ipv4_node_str_init(char *netstr)

{
  zt_mem_pool *pzVar1;
  zt_ipv4_addr *pzVar2;
  long in_RDI;
  zt_mem_pool *pool;
  zt_ipv4_addr *addr;
  zt_ipv4_node *node;
  zt_mem_pool *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff8;
  zt_ipv4_node *netstr_00;
  
  if (in_RDI == 0) {
    netstr_00 = (zt_ipv4_node *)0x0;
  }
  else {
    pzVar1 = zt_mem_pool_get(in_stack_fffffffffffffff8);
    if (pzVar1 == (zt_mem_pool *)0x0) {
      netstr_00 = (zt_ipv4_node *)0x0;
    }
    else {
      netstr_00 = (zt_ipv4_node *)zt_mem_pool_alloc(in_stack_ffffffffffffffe8);
      if (netstr_00 == (zt_ipv4_node *)0x0) {
        netstr_00 = (zt_ipv4_node *)0x0;
      }
      else {
        pzVar2 = zt_ipv4_addr_frm_str((char *)netstr_00);
        if (pzVar2 == (zt_ipv4_addr *)0x0) {
          netstr_00 = (zt_ipv4_node *)0x0;
        }
        else {
          netstr_00->addr = pzVar2;
          netstr_00->next = (zt_ipv4_node *)0x0;
        }
      }
    }
  }
  return netstr_00;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_node_str_init(const char *netstr)
{
    zt_ipv4_node *node;
    zt_ipv4_addr *addr;
    zt_mem_pool  *pool;

    if (!netstr) {
        return NULL;
    }

    if (!(pool = zt_mem_pool_get("zt_ipv4_node"))) {
        return NULL;
    }

    if (!(node = zt_mem_pool_alloc(pool))) {
        return NULL;
    }

    if (!(addr = zt_ipv4_addr_frm_str(netstr))) {
        return NULL;
    }

    node->addr = addr;
    node->next = NULL;

    return node;
}